

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O0

QPDFObjectHandle __thiscall
QPDFPageObjectHelper::getFormXObjectForPage(QPDFPageObjectHelper *this,bool handle_transformations)

{
  bool bVar1;
  ContentProvider *this_00;
  byte in_DL;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined7 in_register_00000031;
  element_type *this_01;
  QPDFObjectHandle QVar3;
  Matrix local_3c8;
  QPDFObjectHandle local_398;
  allocator<char> local_381;
  string local_380;
  allocator<char> local_359;
  string local_358 [32];
  undefined1 local_338 [8];
  QPDFObjectHandle scale_obj;
  string local_320 [32];
  undefined1 local_300 [8];
  QPDFObjectHandle rotate_obj;
  undefined1 local_2b9;
  undefined1 local_2b8 [24];
  shared_ptr<QPDFObjectHandle::StreamDataProvider> provider;
  string local_290;
  allocator<char> local_269;
  string local_268;
  undefined1 local_248 [32];
  undefined1 local_228 [8];
  QPDFObjectHandle bbox;
  string local_210 [32];
  undefined1 local_1f0 [40];
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0 [32];
  undefined1 local_180 [40];
  string local_158;
  allocator<char> local_131;
  string local_130;
  QPDFObjectHandle local_110;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  QPDFObjectHandle local_b0;
  allocator<char> local_99;
  string local_98;
  undefined1 local_78 [8];
  QPDFObjectHandle newdict;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [31];
  bool handle_transformations_local;
  QPDFPageObjectHelper *this_local;
  QPDFObjectHandle *result;
  
  this_01 = (element_type *)CONCAT71(in_register_00000031,handle_transformations);
  local_30[0x17] = in_DL & 1;
  local_30[0x16] = 0;
  unique0x10000f6c = this_01;
  this_local = this;
  QPDFObjectHelper::oh((QPDFObjectHelper *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "QPDFPageObjectHelper::getFormXObjectForPage called with a direct object",&local_51);
  QPDFObjectHandle::getQPDF((QPDFObjectHandle *)local_30,&local_50);
  QPDF::newStream((QPDF *)this);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_30);
  QPDFObjectHandle::getDict((QPDFObjectHandle *)local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"/Type",&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"/XObject",&local_d1);
  QPDFObjectHandle::newName(&local_b0,&local_d0);
  QPDFObjectHandle::replaceKey((QPDFObjectHandle *)local_78,&local_98,&local_b0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"/Subtype",&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"/Form",&local_131);
  QPDFObjectHandle::newName(&local_110,&local_130);
  QPDFObjectHandle::replaceKey((QPDFObjectHandle *)local_78,&local_f8,&local_110);
  QPDFObjectHandle::~QPDFObjectHandle(&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"/Resources",(allocator<char> *)(local_180 + 0x27));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a0,"/Resources",&local_1a1);
  getAttribute((QPDFPageObjectHelper *)local_180,(string *)this_01,SUB81(local_1a0,0));
  QPDFObjectHandle::shallowCopy((QPDFObjectHandle *)(local_180 + 0x10));
  QPDFObjectHandle::replaceKey
            ((QPDFObjectHandle *)local_78,&local_158,(QPDFObjectHandle *)(local_180 + 0x10));
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_180 + 0x10));
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_180);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)(local_180 + 0x27));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"/Group",(allocator<char> *)(local_1f0 + 0x27));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_210,"/Group",
             (allocator<char> *)
             ((long)&bbox.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  getAttribute((QPDFPageObjectHelper *)local_1f0,(string *)this_01,SUB81(local_210,0));
  QPDFObjectHandle::shallowCopy((QPDFObjectHandle *)(local_1f0 + 0x10));
  QPDFObjectHandle::replaceKey
            ((QPDFObjectHandle *)local_78,&local_1c8,(QPDFObjectHandle *)(local_1f0 + 0x10));
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_1f0 + 0x10));
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_1f0);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&bbox.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)(local_1f0 + 0x27));
  getTrimBox((QPDFPageObjectHelper *)(local_248 + 0x10),handle_transformations,false);
  QPDFObjectHandle::shallowCopy((QPDFObjectHandle *)local_228);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_248 + 0x10));
  bVar1 = QPDFObjectHandle::isRectangle((QPDFObjectHandle *)local_228);
  if (!bVar1) {
    QPDFObjectHelper::oh((QPDFObjectHelper *)local_248);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,
               "bounding box is invalid; form XObject created from page will not work",&local_269);
    QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_248,&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator(&local_269);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_248);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"/BBox",
             (allocator<char> *)
             ((long)&provider.
                     super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  QPDFObjectHandle::replaceKey
            ((QPDFObjectHandle *)local_78,&local_290,(QPDFObjectHandle *)local_228);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&provider.
                     super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  this_00 = (ContentProvider *)operator_new(0x20);
  local_2b9 = 1;
  QPDFObjectHelper::oh((QPDFObjectHelper *)local_2b8);
  anon_unknown.dwarf_40ecad::ContentProvider::ContentProvider(this_00,(QPDFObjectHandle *)local_2b8)
  ;
  local_2b9 = 0;
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::
  shared_ptr<(anonymous_namespace)::ContentProvider,void>
            ((shared_ptr<QPDFObjectHandle::StreamDataProvider> *)(local_2b8 + 0x10),this_00);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_2b8);
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::shared_ptr
            ((shared_ptr<QPDFObjectHandle::StreamDataProvider> *)&stack0xfffffffffffffd30,
             (shared_ptr<QPDFObjectHandle::StreamDataProvider> *)(local_2b8 + 0x10));
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::replaceStreamData
            ((QPDFObjectHandle *)this,
             (shared_ptr<QPDFObjectHandle::StreamDataProvider> *)&stack0xfffffffffffffd30,
             (QPDFObjectHandle *)&stack0xfffffffffffffd20,
             (QPDFObjectHandle *)
             &rotate_obj.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &rotate_obj.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xfffffffffffffd20);
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::~shared_ptr
            ((shared_ptr<QPDFObjectHandle::StreamDataProvider> *)&stack0xfffffffffffffd30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_320,"/Rotate",
             (allocator<char> *)
             ((long)&scale_obj.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  getAttribute((QPDFPageObjectHelper *)local_300,(string *)this_01,SUB81(local_320,0));
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&scale_obj.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_358,"/UserUnit",&local_359);
  getAttribute((QPDFPageObjectHelper *)local_338,(string *)this_01,SUB81(local_358,0));
  std::__cxx11::string::~string(local_358);
  std::allocator<char>::~allocator(&local_359);
  if (((local_30[0x17] & 1) != 0) &&
     ((bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_300), !bVar1 ||
      (bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_338), !bVar1)))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"/Matrix",&local_381);
    getMatrixForTransformations(&local_3c8,(QPDFPageObjectHelper *)this_01,false);
    QPDFObjectHandle::newArray(&local_398,&local_3c8);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)local_78,&local_380,&local_398);
    QPDFObjectHandle::~QPDFObjectHandle(&local_398);
    std::__cxx11::string::~string((string *)&local_380);
    std::allocator<char>::~allocator(&local_381);
  }
  local_30[0x16] = 1;
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_338);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_300);
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::~shared_ptr
            ((shared_ptr<QPDFObjectHandle::StreamDataProvider> *)(local_2b8 + 0x10));
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_228);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_78);
  _Var2._M_pi = extraout_RDX;
  if ((local_30[0x16] & 1) == 0) {
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)this);
    _Var2._M_pi = extraout_RDX_00;
  }
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFPageObjectHelper::getFormXObjectForPage(bool handle_transformations)
{
    auto result =
        oh().getQPDF("QPDFPageObjectHelper::getFormXObjectForPage called with a direct object")
            .newStream();
    QPDFObjectHandle newdict = result.getDict();
    newdict.replaceKey("/Type", QPDFObjectHandle::newName("/XObject"));
    newdict.replaceKey("/Subtype", QPDFObjectHandle::newName("/Form"));
    newdict.replaceKey("/Resources", getAttribute("/Resources", false).shallowCopy());
    newdict.replaceKey("/Group", getAttribute("/Group", false).shallowCopy());
    QPDFObjectHandle bbox = getTrimBox(false).shallowCopy();
    if (!bbox.isRectangle()) {
        oh().warnIfPossible(
            "bounding box is invalid; form XObject created from page will not work");
    }
    newdict.replaceKey("/BBox", bbox);
    auto provider =
        std::shared_ptr<QPDFObjectHandle::StreamDataProvider>(new ContentProvider(oh()));
    result.replaceStreamData(provider, QPDFObjectHandle::newNull(), QPDFObjectHandle::newNull());
    QPDFObjectHandle rotate_obj = getAttribute("/Rotate", false);
    QPDFObjectHandle scale_obj = getAttribute("/UserUnit", false);
    if (handle_transformations && (!(rotate_obj.isNull() && scale_obj.isNull()))) {
        newdict.replaceKey("/Matrix", QPDFObjectHandle::newArray(getMatrixForTransformations()));
    }

    return result;
}